

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageOptions::MergePartialFromCodedStream
          (MessageOptions *this,CodedInputStream *input)

{
  int *piVar1;
  uint8 uVar2;
  int iVar3;
  int iVar4;
  void **ppvVar5;
  bool bVar6;
  uint uVar7;
  Limit limit;
  UninterpretedOption *this_00;
  uint8 *puVar8;
  uint32 tag;
  ExtensionSet *this_01;
  uint32 local_4c;
  uint32 local_48;
  uint32 local_44;
  RepeatedPtrFieldBase *local_40;
  ExtensionSet *local_38;
  
  local_40 = &(this->uninterpreted_option_).super_RepeatedPtrFieldBase;
  local_38 = &this->_extensions_;
  this_01 = local_38;
LAB_001f0598:
  while( true ) {
    puVar8 = input->buffer_;
    if ((puVar8 < input->buffer_end_) && (tag = (uint32)(char)*puVar8, -1 < (char)*puVar8)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar8 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    uVar7 = tag >> 3;
    if (uVar7 != 999) break;
    if ((tag & 7) != 2) goto LAB_001f0620;
    while( true ) {
      iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        this_00 = (UninterpretedOption *)ppvVar5[iVar3];
      }
      else {
        iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve(local_40,iVar3 + 1);
        }
        piVar1 = &(this->uninterpreted_option_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption>::New();
        ppvVar5 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
        (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar5[iVar3] = this_00;
      }
      puVar8 = input->buffer_;
      if ((puVar8 < input->buffer_end_) && (uVar2 = *puVar8, -1 < (char)uVar2)) {
        input->buffer_ = puVar8 + 1;
        local_44 = (int)(char)uVar2;
      }
      else {
        bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_44);
        if (!bVar6) {
          return false;
        }
      }
      iVar3 = input->recursion_depth_;
      input->recursion_depth_ = iVar3 + 1;
      if (input->recursion_limit_ <= iVar3) {
        return false;
      }
      limit = io::CodedInputStream::PushLimit(input,local_44);
      bVar6 = UninterpretedOption::MergePartialFromCodedStream(this_00,input);
      if (!bVar6) {
        return false;
      }
      if (input->legitimate_message_end_ != true) {
        return false;
      }
      io::CodedInputStream::PopLimit(input,limit);
      if (0 < input->recursion_depth_) {
        input->recursion_depth_ = input->recursion_depth_ + -1;
      }
      puVar8 = input->buffer_;
      if ((((int)input->buffer_end_ - (int)puVar8 < 2) || (*puVar8 != 0xba)) || (puVar8[1] != '>'))
      break;
LAB_001f0804:
      input->buffer_ = puVar8 + 2;
    }
    this_01 = local_38;
    if ((input->buffer_ == input->buffer_end_) &&
       ((input->buffer_size_after_limit_ != 0 || (input->total_bytes_read_ == input->current_limit_)
        ))) {
      input->last_tag_ = 0;
      input->legitimate_message_end_ = true;
      return true;
    }
  }
  if (uVar7 == 2) {
    if ((tag & 7) == 0) {
LAB_001f06a7:
      puVar8 = input->buffer_;
      if ((puVar8 < input->buffer_end_) && (uVar2 = *puVar8, -1 < (char)uVar2)) {
        input->buffer_ = puVar8 + 1;
        local_4c = (int)(char)uVar2;
      }
      else {
        bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
        if (!bVar6) {
          return false;
        }
      }
      this->no_standard_descriptor_accessor_ = local_4c != 0;
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
      puVar8 = input->buffer_;
      if (((1 < *(int *)&input->buffer_end_ - (int)puVar8) && (*puVar8 == 0xba)) &&
         (puVar8[1] == '>')) goto LAB_001f0804;
      goto LAB_001f0598;
    }
  }
  else if ((uVar7 == 1) && ((tag & 7) == 0)) {
    puVar8 = input->buffer_;
    if ((puVar8 < input->buffer_end_) && (uVar2 = *puVar8, -1 < (char)uVar2)) {
      input->buffer_ = puVar8 + 1;
      local_48 = (int)(char)uVar2;
    }
    else {
      bVar6 = io::CodedInputStream::ReadVarint32Fallback(input,&local_48);
      if (!bVar6) {
        return false;
      }
    }
    this->message_set_wire_format_ = local_48 != 0;
    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
    puVar8 = input->buffer_;
    if ((puVar8 < input->buffer_end_) && (*puVar8 == '\x10')) {
      input->buffer_ = puVar8 + 1;
      goto LAB_001f06a7;
    }
    goto LAB_001f0598;
  }
LAB_001f0620:
  if ((tag & 7) == 4) {
    return true;
  }
  if (tag < 8000) {
    bVar6 = internal::WireFormat::SkipField(input,tag,&this->_unknown_fields_);
  }
  else {
    bVar6 = internal::ExtensionSet::ParseField
                      (this_01,tag,input,default_instance_,&this->_unknown_fields_);
  }
  if (bVar6 == false) {
    return false;
  }
  goto LAB_001f0598;
}

Assistant:

bool MessageOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional bool message_set_wire_format = 1 [default = false];
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &message_set_wire_format_)));
          set_has_message_set_wire_format();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(16)) goto parse_no_standard_descriptor_accessor;
        break;
      }

      // optional bool no_standard_descriptor_accessor = 2 [default = false];
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_no_standard_descriptor_accessor:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &no_standard_descriptor_accessor_)));
          set_has_no_standard_descriptor_accessor();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_uninterpreted_option:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(7994)) goto parse_uninterpreted_option;
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, default_instance_,
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}